

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O1

void __thiscall
VW::object_pool<example,_example_initializer>::new_chunk
          (object_pool<example,_example_initializer> *this,size_t size)

{
  iterator *piVar1;
  pointer *pppVar2;
  undefined8 *puVar3;
  pointer puVar4;
  iterator __position;
  _Elt_pointer ppeVar5;
  undefined1 auVar6 [16];
  long lVar7;
  example *peVar8;
  pointer *__ptr;
  long lVar9;
  ulong uVar10;
  long lVar11;
  pair<example_*,_example_*> local_58;
  deque<example*,std::allocator<example*>> *local_48;
  example_initializer *local_40;
  long local_38;
  
  if (size != 0) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = size;
    uVar10 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0x68d0),8) == 0) {
      uVar10 = SUB168(auVar6 * ZEXT816(0x68d0),0);
    }
    local_58.first = (example *)operator_new__(uVar10);
    peVar8 = local_58.first;
    do {
      lVar9 = 0x20;
      do {
        puVar3 = (undefined8 *)
                 ((long)&(peVar8->super_example_predict).feature_space[0].indicies.end_array + lVar9
                 );
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)
                 ((long)&(peVar8->super_example_predict).feature_space[0].indicies._begin + lVar9);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)
                 ((long)&(peVar8->super_example_predict).feature_space[0].values.end_array + lVar9);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)
                 ((long)&(peVar8->super_example_predict).feature_space[0].values._begin + lVar9);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)(peVar8->super_example_predict).feature_space + lVar9 + -0x10)
        ;
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)(peVar8->super_example_predict).feature_space + lVar9 + -0x20)
        ;
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined4 *)
         ((long)&(peVar8->super_example_predict).feature_space[0].space_names._begin + lVar9) = 0;
        lVar9 = lVar9 + 0x68;
      } while (lVar9 != 0x6820);
      peVar8 = peVar8 + 1;
    } while (peVar8 != local_58.first + size);
    std::
    vector<std::unique_ptr<example[],std::default_delete<example[]>>,std::allocator<std::unique_ptr<example[],std::default_delete<example[]>>>>
    ::emplace_back<std::unique_ptr<example[],std::default_delete<example[]>>>
              ((vector<std::unique_ptr<example[],std::default_delete<example[]>>,std::allocator<std::unique_ptr<example[],std::default_delete<example[]>>>>
                *)&this->m_chunks,
               (unique_ptr<example[],_std::default_delete<example[]>_> *)&local_58);
    if (local_58.first != (example *)0x0) {
      operator_delete__(local_58.first);
    }
    puVar4 = (this->m_chunks).
             super__Vector_base<std::unique_ptr<example[],_std::default_delete<example[]>_>,_std::allocator<std::unique_ptr<example[],_std::default_delete<example[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_58.first =
         puVar4[-1]._M_t.super___uniq_ptr_impl<example,_std::default_delete<example[]>_>._M_t.
         super__Tuple_impl<0UL,_example_*,_std::default_delete<example[]>_>.
         super__Head_base<0UL,_example_*,_false>._M_head_impl;
    local_58.second = local_58.first + size + -1;
    __position._M_current =
         (this->m_chunk_bounds).
         super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_chunk_bounds).
        super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::pair<example*,example*>,std::allocator<std::pair<example*,example*>>>::
      _M_realloc_insert<std::pair<example*,example*>>
                ((vector<std::pair<example*,example*>,std::allocator<std::pair<example*,example*>>>
                  *)&this->m_chunk_bounds,__position,&local_58);
    }
    else {
      (__position._M_current)->first = local_58.first;
      (__position._M_current)->second = local_58.second;
      pppVar2 = &(this->m_chunk_bounds).
                 super__Vector_base<std::pair<example_*,_example_*>,_std::allocator<std::pair<example_*,_example_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + 1;
    }
    local_40 = (example_initializer *)&this->field_0xa8;
    local_48 = (deque<example*,std::allocator<example*>> *)&this->m_pool;
    local_38 = size + (size == 0);
    lVar11 = 0;
    lVar9 = 0;
    do {
      memset(puVar4[-1]._M_t.super___uniq_ptr_impl<example,_std::default_delete<example[]>_>._M_t.
             super__Tuple_impl<0UL,_example_*,_std::default_delete<example[]>_>.
             super__Head_base<0UL,_example_*,_false>._M_head_impl + lVar9,0,0x68d0);
      peVar8 = puVar4[-1]._M_t.super___uniq_ptr_impl<example,_std::default_delete<example[]>_>._M_t.
               super__Tuple_impl<0UL,_example_*,_std::default_delete<example[]>_>.
               super__Head_base<0UL,_example_*,_false>._M_head_impl;
      memset(peVar8 + lVar9,0,0x68d0);
      lVar7 = 0x20;
      do {
        puVar3 = (undefined8 *)
                 ((long)(peVar8->super_example_predict).feature_space + lVar7 + lVar11 + 0x30U);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)
                 ((long)(peVar8->super_example_predict).feature_space + lVar7 + lVar11 + 0x20U);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)
                 ((long)(peVar8->super_example_predict).feature_space + lVar7 + lVar11 + 0x10U);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)
                 ((long)(peVar8->super_example_predict).feature_space + lVar7 + lVar11);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)
                 ((long)(peVar8->super_example_predict).feature_space +
                 lVar7 + lVar11 + 0xfffffffffffffff0U);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)
                 ((long)(peVar8->super_example_predict).feature_space +
                 lVar7 + lVar11 + 0xffffffffffffffe0U);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined4 *)
         ((long)(peVar8->super_example_predict).feature_space + lVar7 + lVar11 + 0x40U) = 0;
        lVar7 = lVar7 + 0x68;
      } while (lVar7 != 0x6820);
      local_58.first =
           example_initializer::operator()
                     (local_40,puVar4[-1]._M_t.
                               super___uniq_ptr_impl<example,_std::default_delete<example[]>_>._M_t.
                               super__Tuple_impl<0UL,_example_*,_std::default_delete<example[]>_>.
                               super__Head_base<0UL,_example_*,_false>._M_head_impl + lVar9);
      ppeVar5 = (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (ppeVar5 ==
          (this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<example*,std::allocator<example*>>::_M_push_back_aux<example*>
                  (local_48,&local_58.first);
      }
      else {
        *ppeVar5 = local_58.first;
        piVar1 = &(this->m_pool).c.super__Deque_base<example_*,_std::allocator<example_*>_>._M_impl.
                  super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 0x68d0;
    } while (lVar9 != local_38);
  }
  return;
}

Assistant:

void new_chunk(size_t size)
  {
    if(size == 0)
    {
      return;
    }

    m_chunks.push_back(std::unique_ptr<T[]>(new T[size]));
    auto& chunk = m_chunks.back();
    m_chunk_bounds.push_back({&chunk[0], &chunk[size - 1]});

    for (size_t i = 0; i < size; i++)
    {
      memset(&chunk[i], 0, sizeof(T));
      new (&chunk[i]) T{};
      m_pool.push(m_initializer(&chunk[i]));
    }
  }